

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O2

void __thiscall QNetworkRequestPrivate::~QNetworkRequestPrivate(QNetworkRequestPrivate *this)

{
  QSslConfiguration *this_00;
  
  this_00 = this->sslConfiguration;
  if (this_00 != (QSslConfiguration *)0x0) {
    QSslConfiguration::~QSslConfiguration(this_00);
  }
  operator_delete(this_00,8);
  QHttp2Configuration::~QHttp2Configuration(&this->h2Configuration);
  QHttp1Configuration::~QHttp1Configuration(&this->h1Configuration);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->peerVerifyName).d);
  QUrl::~QUrl(&this->url);
  QNetworkHeadersPrivate::~QNetworkHeadersPrivate(&this->super_QNetworkHeadersPrivate);
  return;
}

Assistant:

~QNetworkRequestPrivate()
    {
#ifndef QT_NO_SSL
        delete sslConfiguration;
#endif
    }